

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_act.c
# Opt level: O2

bool redit_rlist(CHAR_DATA *ch,char *argument)

{
  AREA_DATA_conflict *pAVar1;
  BUFFER *buffer;
  ROOM_INDEX_DATA *pRVar2;
  char *pcVar3;
  uint vnum;
  int iVar4;
  bool bVar5;
  char arg [4608];
  char buf [4608];
  
  one_argument(argument,arg);
  pAVar1 = ch->in_room->area;
  buffer = new_buf();
  bVar5 = false;
  iVar4 = 0;
  for (vnum = (uint)pAVar1->min_vnum; (int)vnum <= (int)pAVar1->max_vnum; vnum = vnum + 1) {
    pRVar2 = get_room_index(vnum);
    if (pRVar2 != (ROOM_INDEX_DATA *)0x0) {
      pcVar3 = capitalize(pRVar2->name);
      sprintf(buf,"[%5d] %-17.16s",(ulong)vnum,pcVar3);
      add_buf(buffer,buf);
      iVar4 = iVar4 + 1;
      bVar5 = true;
      if (iVar4 % 3 == 0) {
        add_buf(buffer,"\n\r");
      }
    }
  }
  if (bVar5) {
    if (iVar4 % 3 != 0) {
      add_buf(buffer,"\n\r");
    }
    pcVar3 = buf_string(buffer);
    page_to_char(pcVar3,ch);
    free_buf(buffer);
  }
  else {
    send_to_char("Room(s) not found in this area.\n\r",ch);
  }
  return false;
}

Assistant:

bool redit_rlist(CHAR_DATA *ch, char *argument)
{
	ROOM_INDEX_DATA *pRoomIndex;
	AREA_DATA *pArea;
	char buf[MAX_STRING_LENGTH];
	BUFFER *buf1;
	char arg[MAX_INPUT_LENGTH];
	bool found;
	int vnum;
	int col = 0;

	one_argument(argument, arg);

	pArea = ch->in_room->area;
	buf1 = new_buf();
	/*    buf1[0] = '\0'; */
	found = false;

	for (vnum = pArea->min_vnum; vnum <= pArea->max_vnum; vnum++)
	{
		pRoomIndex = get_room_index(vnum);
		if (pRoomIndex)
		{
			found = true;

			sprintf(buf, "[%5d] %-17.16s", vnum, capitalize(pRoomIndex->name));
			add_buf(buf1, buf);

			if (++col % 3 == 0)
				add_buf(buf1, "\n\r");
		}
	}

	if (!found)
	{
		send_to_char("Room(s) not found in this area.\n\r", ch);
		return false;
	}

	if (col % 3 != 0)
		add_buf(buf1, "\n\r");

	page_to_char(buf_string(buf1), ch);
	free_buf(buf1);
	return false;
}